

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O1

bool __thiscall
pstore::command_line::
list<pstore::trailer::indices,_pstore::command_line::parser<pstore::trailer::indices,_void>_>::
comma_separated(list<pstore::trailer::indices,_pstore::command_line::parser<pstore::trailer::indices,_void>_>
                *this,string *v)

{
  bool bVar1;
  _List_node_base *p_Var2;
  _List_node_base local_30;
  
  csv((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&local_30,v);
  p_Var2 = &local_30;
  do {
    p_Var2 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == &local_30) break;
    bVar1 = simple_value(this,(string *)(p_Var2 + 1));
  } while (bVar1);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_30);
  return p_Var2 == &local_30;
}

Assistant:

bool list<T, Parser>::comma_separated (std::string const & v) {
            for (auto const & subvalue : csv (v)) {
                if (!this->simple_value (subvalue)) {
                    return false;
                }
            }
            return true;
        }